

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Option::Clear(Option *this)

{
  Any *this_00;
  anon_union_24_1_493b367e_for_Option_3 aVar1;
  LogMessageFatal local_20;
  
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x3) != (undefined1  [24])0x0) {
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.name_);
    }
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      this_00 = (this->field_0)._impl_.value_;
      if (this_00 == (Any *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
                   ,0x9af,"_impl_.value_ != nullptr");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      Any::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Option::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Option)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.value_ != nullptr);
      _impl_.value_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}